

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O2

void __thiscall CNet::AddPin(CNet *this,vector<CPin_*,_std::allocator<CPin_*>_> *pPinList)

{
  int *piVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  CPin **ppCVar5;
  ulong uVar6;
  pointer ppCVar7;
  pointer ppCVar8;
  
  ppCVar8 = (pPinList->super__Vector_base<CPin_*,_std::allocator<CPin_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar7 = (pPinList->super__Vector_base<CPin_*,_std::allocator<CPin_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar4 = (long)ppCVar7 - (long)ppCVar8;
  if (uVar4 == 0) {
    uVar2 = this->m_iNumPin;
  }
  else {
    uVar6 = 0xffffffffffffffff;
    if (-1 < (long)uVar4) {
      uVar6 = uVar4;
    }
    ppCVar5 = (CPin **)operator_new__(uVar6);
    this->m_ppPin = ppCVar5;
    for (uVar2 = 0; uVar4 = (ulong)(short)uVar2, uVar4 < (ulong)((long)ppCVar7 - (long)ppCVar8 >> 3)
        ; uVar2 = uVar2 + 1) {
      this->m_ppPin[uVar4] = ppCVar8[uVar4];
      ppCVar8 = (pPinList->super__Vector_base<CPin_*,_std::allocator<CPin_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar7 = (pPinList->super__Vector_base<CPin_*,_std::allocator<CPin_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    }
    this->m_iNumPin = uVar2;
  }
  if (uVar2 < 2) {
    piVar1 = &(this->super_CObject).m_iProp;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  else {
    if (uVar2 == 2) {
      uVar3 = (this->super_CObject).m_iProp & 0xfffffffcU | 2;
    }
    else {
      uVar3 = (this->super_CObject).m_iProp & 0xfffffff8U | 4;
    }
    (this->super_CObject).m_iProp = uVar3;
  }
  return;
}

Assistant:

void CNet::AddPin(vector<CPin*>* pPinList)
{
	if(pPinList->size())
	{
		m_ppPin	=	new	CPin*[pPinList->size()];
		for(m_iNumPin=0;m_iNumPin<pPinList->size();m_iNumPin++)	m_ppPin[m_iNumPin]	=	(*pPinList)[m_iNumPin];
	}

	switch(GetNumPin()){
	case 0:
	case 1:
		m_iProp	|=	PROP_NET_LOCAL;
		break;
	case 2:
		m_iProp	&=	~PROP_NET_LOCAL;
		m_iProp	|=	PROP_NET_TWOPIN;
		break;
	default:
		m_iProp	&=	~(PROP_NET_LOCAL|PROP_NET_TWOPIN);
		m_iProp	|=	PROP_NET_GLOBAL;
		break;
	}
}